

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O2

void deqp::gls::setupDefaultUniforms(RenderContext *context,deUint32 programID)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [14];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  unkuint9 Var10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  int iVar16;
  undefined4 extraout_var;
  long lVar18;
  undefined1 auVar19 [15];
  undefined1 local_48 [16];
  long lVar17;
  
  iVar16 = (*context->_vptr_RenderContext[3])();
  lVar17 = CONCAT44(extraout_var,iVar16);
  for (lVar18 = 0; lVar18 != 0x20; lVar18 = lVar18 + 0x10) {
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)&setupDefaultUniforms::s_boolUniforms[0].name + lVar18));
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x14f0))
                (iVar16,(&setupDefaultUniforms::s_boolUniforms[0].value)[lVar18]);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_bvec4Uniforms == '\0') {
    iVar16 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                  s_bvec4Uniforms);
    if (iVar16 != 0) {
      setupDefaultUniforms::s_bvec4Uniforms[0].name = "ub4_true";
      tcu::Vector<bool,_4>::Vector(&setupDefaultUniforms::s_bvec4Uniforms[0].value,true);
      setupDefaultUniforms::s_bvec4Uniforms[1].name = "ub4_false";
      tcu::Vector<bool,_4>::Vector(&setupDefaultUniforms::s_bvec4Uniforms[1].value,false);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_bvec4Uniforms);
    }
  }
  for (lVar18 = 0; lVar18 != 0x20; lVar18 = lVar18 + 0x10) {
    auVar19._8_7_ = 0;
    auVar19._0_8_ = *(ulong *)(setupDefaultUniforms::s_bvec4Uniforms[0].value.m_data + lVar18);
    auVar19 = auVar19 & DAT_017d1ce0._0_15_;
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar19._0_13_;
    auVar1[0xe] = auVar19[7];
    auVar3[0xc] = auVar19[6];
    auVar3._0_12_ = auVar19._0_12_;
    auVar3._13_2_ = auVar1._13_2_;
    auVar4[0xb] = 0;
    auVar4._0_11_ = auVar19._0_11_;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5[10] = auVar19[5];
    auVar5._0_10_ = auVar19._0_10_;
    auVar5._11_4_ = auVar4._11_4_;
    auVar6[9] = 0;
    auVar6._0_9_ = auVar19._0_9_;
    auVar6._10_5_ = auVar5._10_5_;
    auVar7[8] = auVar19[4];
    auVar7._0_8_ = auVar19._0_8_;
    auVar7._9_6_ = auVar6._9_6_;
    auVar9._7_8_ = 0;
    auVar9._0_7_ = auVar7._8_7_;
    Var10 = CONCAT81(SUB158(auVar9 << 0x40,7),auVar19[3]);
    auVar14._9_6_ = 0;
    auVar14._0_9_ = Var10;
    auVar11._1_10_ = SUB1510(auVar14 << 0x30,5);
    auVar11[0] = auVar19[2];
    auVar15._11_4_ = 0;
    auVar15._0_11_ = auVar11;
    auVar12._1_12_ = SUB1512(auVar15 << 0x20,3);
    auVar12[0] = auVar19[1];
    local_48._0_2_ = CONCAT11(0,auVar19[0]);
    auVar8._2_13_ = auVar12;
    auVar8._0_2_ = local_48._0_2_;
    auVar2._10_2_ = 0;
    auVar2._0_10_ = auVar8._0_10_;
    auVar2._12_2_ = (short)Var10;
    auVar13._2_4_ = auVar2._10_4_;
    auVar13._0_2_ = auVar11._0_2_;
    auVar13._6_8_ = 0;
    local_48._6_8_ = SUB148(auVar13 << 0x40,6);
    local_48._4_2_ = auVar12._0_2_;
    local_48._2_2_ = 0;
    local_48._14_2_ = 0;
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)&((BVec4Uniform *)
                                 (&setupDefaultUniforms::s_bvec4Uniforms[0].value + -2))->name +
                         lVar18));
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x15b8))(iVar16,1,local_48);
    }
  }
  for (lVar18 = 8; lVar18 != 0xb8; lVar18 = lVar18 + 0x10) {
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)(&setupDefaultUniforms::s_boolUniforms[1].value + lVar18));
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x14f0))
                (iVar16,*(undefined4 *)((long)&setupDefaultUniforms::s_intUniforms[0].name + lVar18)
                );
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec2Uniforms == '\0') {
    iVar16 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                  s_ivec2Uniforms);
    if (iVar16 != 0) {
      setupDefaultUniforms::s_ivec2Uniforms[0].name = "ui2_minusOne";
      setupDefaultUniforms::s_ivec2Uniforms[0].value.m_data[0] = -1;
      setupDefaultUniforms::s_ivec2Uniforms[0].value.m_data[1] = -1;
      setupDefaultUniforms::s_ivec2Uniforms[1].name = "ui2_zero";
      setupDefaultUniforms::s_ivec2Uniforms[1].value.m_data[0] = 0;
      setupDefaultUniforms::s_ivec2Uniforms[1].value.m_data[1] = 0;
      setupDefaultUniforms::s_ivec2Uniforms[2].name = "ui2_one";
      setupDefaultUniforms::s_ivec2Uniforms[2].value.m_data = (int  [2])&DAT_100000001;
      setupDefaultUniforms::s_ivec2Uniforms[3].name = "ui2_two";
      setupDefaultUniforms::s_ivec2Uniforms[3].value.m_data[0] = 2;
      setupDefaultUniforms::s_ivec2Uniforms[3].value.m_data[1] = 2;
      setupDefaultUniforms::s_ivec2Uniforms[4].name = "ui2_four";
      setupDefaultUniforms::s_ivec2Uniforms[4].value.m_data[0] = 4;
      setupDefaultUniforms::s_ivec2Uniforms[4].value.m_data[1] = 4;
      setupDefaultUniforms::s_ivec2Uniforms[5].name = "ui2_five";
      setupDefaultUniforms::s_ivec2Uniforms[5].value.m_data[0] = 5;
      setupDefaultUniforms::s_ivec2Uniforms[5].value.m_data[1] = 5;
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_ivec2Uniforms);
    }
  }
  for (lVar18 = 0; lVar18 != 0x60; lVar18 = lVar18 + 0x10) {
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)&((IVec2Uniform *)
                                 (&setupDefaultUniforms::s_ivec2Uniforms[0].value + -1))->name +
                         lVar18));
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x1538))(iVar16,1,lVar18 + 0x1f527a8);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec3Uniforms == '\0') {
    iVar16 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                  s_ivec3Uniforms);
    if (iVar16 != 0) {
      setupDefaultUniforms::s_ivec3Uniforms[0].name = "ui3_minusOne";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[0].value,-1);
      setupDefaultUniforms::s_ivec3Uniforms[1].name = "ui3_zero";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[1].value,0);
      setupDefaultUniforms::s_ivec3Uniforms[2].name = "ui3_one";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[2].value,1);
      setupDefaultUniforms::s_ivec3Uniforms[3].name = "ui3_two";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[3].value,2);
      setupDefaultUniforms::s_ivec3Uniforms[4].name = "ui3_four";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[4].value,4);
      setupDefaultUniforms::s_ivec3Uniforms[5].name = "ui3_five";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[5].value,5);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_ivec3Uniforms);
    }
  }
  for (lVar18 = 0; lVar18 != 0x90; lVar18 = lVar18 + 0x18) {
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)setupDefaultUniforms::s_ivec3Uniforms[0].value.m_data + lVar18 + -8)
                       );
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x1578))(iVar16,1,lVar18 + 0x1f52818);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec4Uniforms == '\0') {
    iVar16 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                  s_ivec4Uniforms);
    if (iVar16 != 0) {
      setupDefaultUniforms::s_ivec4Uniforms[0].name = "ui4_minusOne";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[0].value,-1);
      setupDefaultUniforms::s_ivec4Uniforms[1].name = "ui4_zero";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[1].value,0);
      setupDefaultUniforms::s_ivec4Uniforms[2].name = "ui4_one";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[2].value,1);
      setupDefaultUniforms::s_ivec4Uniforms[3].name = "ui4_two";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[3].value,2);
      setupDefaultUniforms::s_ivec4Uniforms[4].name = "ui4_four";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[4].value,4);
      setupDefaultUniforms::s_ivec4Uniforms[5].name = "ui4_five";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[5].value,5);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_ivec4Uniforms);
    }
  }
  for (lVar18 = 0; lVar18 != 0x90; lVar18 = lVar18 + 0x18) {
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)setupDefaultUniforms::s_ivec4Uniforms[0].value.m_data + lVar18 + -8)
                       );
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x15b8))(iVar16,1,lVar18 + 0x1f528b8);
    }
  }
  for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 0x10) {
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)&setupDefaultUniforms::s_floatUniforms[0].name + lVar18));
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x14e0))
                (*(undefined4 *)((long)&setupDefaultUniforms::s_floatUniforms[0].value + lVar18),
                 iVar16);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec2Uniforms == '\0') {
    iVar16 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                  s_vec2Uniforms);
    if (iVar16 != 0) {
      setupDefaultUniforms::s_vec2Uniforms[0].name = "uv2_minusOne";
      setupDefaultUniforms::s_vec2Uniforms[0].value.m_data[0] = -1.0;
      setupDefaultUniforms::s_vec2Uniforms[0].value.m_data[1] = -1.0;
      setupDefaultUniforms::s_vec2Uniforms[1].name = "uv2_zero";
      setupDefaultUniforms::s_vec2Uniforms[1].value.m_data[0] = 0.0;
      setupDefaultUniforms::s_vec2Uniforms[1].value.m_data[1] = 0.0;
      setupDefaultUniforms::s_vec2Uniforms[2].name = "uv2_half";
      setupDefaultUniforms::s_vec2Uniforms[2].value.m_data = (float  [2])&DAT_3f0000003f000000;
      setupDefaultUniforms::s_vec2Uniforms[3].name = "uv2_one";
      setupDefaultUniforms::s_vec2Uniforms[3].value.m_data[0] = 1.0;
      setupDefaultUniforms::s_vec2Uniforms[3].value.m_data[1] = 1.0;
      setupDefaultUniforms::s_vec2Uniforms[4].name = "uv2_two";
      setupDefaultUniforms::s_vec2Uniforms[4].value.m_data[0] = 2.0;
      setupDefaultUniforms::s_vec2Uniforms[4].value.m_data[1] = 2.0;
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_vec2Uniforms);
    }
  }
  for (lVar18 = 0; lVar18 != 0x50; lVar18 = lVar18 + 0x10) {
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)&((Vec2Uniform *)
                                 (&setupDefaultUniforms::s_vec2Uniforms[0].value + -1))->name +
                         lVar18));
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x1528))(iVar16,1,lVar18 + 0x1f52958);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec3Uniforms == '\0') {
    iVar16 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                  s_vec3Uniforms);
    if (iVar16 != 0) {
      setupDefaultUniforms::s_vec3Uniforms[0].name = "uv3_minusOne";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[0].value,-1.0);
      setupDefaultUniforms::s_vec3Uniforms[1].name = "uv3_zero";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[1].value,0.0);
      setupDefaultUniforms::s_vec3Uniforms[2].name = "uv3_half";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[2].value,0.5);
      setupDefaultUniforms::s_vec3Uniforms[3].name = "uv3_one";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[3].value,1.0);
      setupDefaultUniforms::s_vec3Uniforms[4].name = "uv3_two";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[4].value,2.0);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_vec3Uniforms);
    }
  }
  for (lVar18 = 0; lVar18 != 0x78; lVar18 = lVar18 + 0x18) {
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)setupDefaultUniforms::s_vec3Uniforms[0].value.m_data + lVar18 + -8))
    ;
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x1568))(iVar16,1,lVar18 + 0x1f529b8);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec4Uniforms == '\0') {
    iVar16 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                  s_vec4Uniforms);
    if (iVar16 != 0) {
      setupDefaultUniforms::s_vec4Uniforms[0].name = "uv4_minusOne";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[0].value,-1.0);
      setupDefaultUniforms::s_vec4Uniforms[1].name = "uv4_zero";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[1].value,0.0);
      setupDefaultUniforms::s_vec4Uniforms[2].name = "uv4_half";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[2].value,0.5);
      setupDefaultUniforms::s_vec4Uniforms[3].name = "uv4_one";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[3].value,1.0);
      setupDefaultUniforms::s_vec4Uniforms[4].name = "uv4_two";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[4].value,2.0);
      setupDefaultUniforms::s_vec4Uniforms[5].name = "uv4_black";
      setupDefaultUniforms::s_vec4Uniforms[5].value.m_data[0] = (float)DAT_0167ea40;
      setupDefaultUniforms::s_vec4Uniforms[5].value.m_data[1] = DAT_0167ea40._4_4_;
      setupDefaultUniforms::s_vec4Uniforms[5].value.m_data[2] = (float)DAT_0167ea48;
      setupDefaultUniforms::s_vec4Uniforms[5].value.m_data[3] = DAT_0167ea48._4_4_;
      setupDefaultUniforms::s_vec4Uniforms[6].name = "uv4_gray";
      setupDefaultUniforms::s_vec4Uniforms[6].value.m_data[0] = _DAT_017d1cf0;
      setupDefaultUniforms::s_vec4Uniforms[6].value.m_data[1] = _UNK_017d1cf4;
      setupDefaultUniforms::s_vec4Uniforms[6].value.m_data[2] = _UNK_017d1cf8;
      setupDefaultUniforms::s_vec4Uniforms[6].value.m_data[3] = _UNK_017d1cfc;
      setupDefaultUniforms::s_vec4Uniforms[7].name = "uv4_white";
      setupDefaultUniforms::s_vec4Uniforms[7].value.m_data[0] = _DAT_0166f110;
      setupDefaultUniforms::s_vec4Uniforms[7].value.m_data[1] = _UNK_0166f114;
      setupDefaultUniforms::s_vec4Uniforms[7].value.m_data[2] = _UNK_0166f118;
      setupDefaultUniforms::s_vec4Uniforms[7].value.m_data[3] = _UNK_0166f11c;
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_vec4Uniforms);
    }
  }
  for (lVar18 = 0; lVar18 != 0xc0; lVar18 = lVar18 + 0x18) {
    iVar16 = (**(code **)(lVar17 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)setupDefaultUniforms::s_vec4Uniforms[0].value.m_data + lVar18 + -8))
    ;
    if (iVar16 != -1) {
      (**(code **)(lVar17 + 0x15a8))(iVar16,1,lVar18 + 0x1f52a38);
    }
  }
  return;
}

Assistant:

void setupDefaultUniforms (const glu::RenderContext& context, deUint32 programID)
{
	const glw::Functions& gl = context.getFunctions();

	// Bool.
	struct BoolUniform { const char* name; bool value; };
	static const BoolUniform s_boolUniforms[] =
	{
		{ "ub_true",	true },
		{ "ub_false",	false },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_boolUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_boolUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1i(uniLoc, s_boolUniforms[i].value);
	}

	// BVec4.
	struct BVec4Uniform { const char* name; BVec4 value; };
	static const BVec4Uniform s_bvec4Uniforms[] =
	{
		{ "ub4_true",	BVec4(true) },
		{ "ub4_false",	BVec4(false) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_bvec4Uniforms); i++)
	{
		const BVec4Uniform& uni = s_bvec4Uniforms[i];
		int arr[4];
		arr[0] = (int)uni.value.x();
		arr[1] = (int)uni.value.y();
		arr[2] = (int)uni.value.z();
		arr[3] = (int)uni.value.w();
		int uniLoc = gl.getUniformLocation(programID, uni.name);
		if (uniLoc != -1)
			gl.uniform4iv(uniLoc, 1, &arr[0]);
	}

	// Int.
	struct IntUniform { const char* name; int value; };
	static const IntUniform s_intUniforms[] =
	{
		{ "ui_minusOne",		-1 },
		{ "ui_zero",			0 },
		{ "ui_one",				1 },
		{ "ui_two",				2 },
		{ "ui_three",			3 },
		{ "ui_four",			4 },
		{ "ui_five",			5 },
		{ "ui_six",				6 },
		{ "ui_seven",			7 },
		{ "ui_eight",			8 },
		{ "ui_oneHundredOne",	101 }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_intUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_intUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1i(uniLoc, s_intUniforms[i].value);
	}

	// IVec2.
	struct IVec2Uniform { const char* name; IVec2 value; };
	static const IVec2Uniform s_ivec2Uniforms[] =
	{
		{ "ui2_minusOne",	IVec2(-1) },
		{ "ui2_zero",		IVec2(0) },
		{ "ui2_one",		IVec2(1) },
		{ "ui2_two",		IVec2(2) },
		{ "ui2_four",		IVec2(4) },
		{ "ui2_five",		IVec2(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec2Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec2Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform2iv(uniLoc, 1, s_ivec2Uniforms[i].value.getPtr());
	}

	// IVec3.
	struct IVec3Uniform { const char* name; IVec3 value; };
	static const IVec3Uniform s_ivec3Uniforms[] =
	{
		{ "ui3_minusOne",	IVec3(-1) },
		{ "ui3_zero",		IVec3(0) },
		{ "ui3_one",		IVec3(1) },
		{ "ui3_two",		IVec3(2) },
		{ "ui3_four",		IVec3(4) },
		{ "ui3_five",		IVec3(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec3Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec3Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform3iv(uniLoc, 1, s_ivec3Uniforms[i].value.getPtr());
	}

	// IVec4.
	struct IVec4Uniform { const char* name; IVec4 value; };
	static const IVec4Uniform s_ivec4Uniforms[] =
	{
		{ "ui4_minusOne",	IVec4(-1) },
		{ "ui4_zero",		IVec4(0) },
		{ "ui4_one",		IVec4(1) },
		{ "ui4_two",		IVec4(2) },
		{ "ui4_four",		IVec4(4) },
		{ "ui4_five",		IVec4(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec4Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec4Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform4iv(uniLoc, 1, s_ivec4Uniforms[i].value.getPtr());
	}

	// Float.
	struct FloatUniform { const char* name; float value; };
	static const FloatUniform s_floatUniforms[] =
	{
		{ "uf_zero",	0.0f },
		{ "uf_one",		1.0f },
		{ "uf_two",		2.0f },
		{ "uf_three",	3.0f },
		{ "uf_four",	4.0f },
		{ "uf_five",	5.0f },
		{ "uf_six",		6.0f },
		{ "uf_seven",	7.0f },
		{ "uf_eight",	8.0f },
		{ "uf_half",	1.0f / 2.0f },
		{ "uf_third",	1.0f / 3.0f },
		{ "uf_fourth",	1.0f / 4.0f },
		{ "uf_fifth",	1.0f / 5.0f },
		{ "uf_sixth",	1.0f / 6.0f },
		{ "uf_seventh",	1.0f / 7.0f },
		{ "uf_eighth",	1.0f / 8.0f }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_floatUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_floatUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1f(uniLoc, s_floatUniforms[i].value);
	}

	// Vec2.
	struct Vec2Uniform { const char* name; Vec2 value; };
	static const Vec2Uniform s_vec2Uniforms[] =
	{
		{ "uv2_minusOne",	Vec2(-1.0f) },
		{ "uv2_zero",		Vec2(0.0f) },
		{ "uv2_half",		Vec2(0.5f) },
		{ "uv2_one",		Vec2(1.0f) },
		{ "uv2_two",		Vec2(2.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec2Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec2Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform2fv(uniLoc, 1, s_vec2Uniforms[i].value.getPtr());
	}

	// Vec3.
	struct Vec3Uniform { const char* name; Vec3 value; };
	static const Vec3Uniform s_vec3Uniforms[] =
	{
		{ "uv3_minusOne",	Vec3(-1.0f) },
		{ "uv3_zero",		Vec3(0.0f) },
		{ "uv3_half",		Vec3(0.5f) },
		{ "uv3_one",		Vec3(1.0f) },
		{ "uv3_two",		Vec3(2.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec3Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec3Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform3fv(uniLoc, 1, s_vec3Uniforms[i].value.getPtr());
	}

	// Vec4.
	struct Vec4Uniform { const char* name; Vec4 value; };
	static const Vec4Uniform s_vec4Uniforms[] =
	{
		{ "uv4_minusOne",	Vec4(-1.0f) },
		{ "uv4_zero",		Vec4(0.0f) },
		{ "uv4_half",		Vec4(0.5f) },
		{ "uv4_one",		Vec4(1.0f) },
		{ "uv4_two",		Vec4(2.0f) },
		{ "uv4_black",		Vec4(0.0f, 0.0f, 0.0f, 1.0f) },
		{ "uv4_gray",		Vec4(0.5f, 0.5f, 0.5f, 1.0f) },
		{ "uv4_white",		Vec4(1.0f, 1.0f, 1.0f, 1.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec4Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec4Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform4fv(uniLoc, 1, s_vec4Uniforms[i].value.getPtr());
	}
}